

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_write_plain(connectdata *conn,curl_socket_t sockfd,void *mem,size_t len,
                         ssize_t *written)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  CURLcode result;
  CURLcode local_14;
  
  local_14 = (CURLcode)((ulong)in_RAX >> 0x20);
  sVar1 = Curl_send_plain(conn,(uint)(conn->sock[1] == sockfd),mem,len,&local_14);
  *written = sVar1;
  return local_14;
}

Assistant:

CURLcode Curl_write_plain(struct connectdata *conn,
                          curl_socket_t sockfd,
                          const void *mem,
                          size_t len,
                          ssize_t *written)
{
  ssize_t bytes_written;
  CURLcode result;
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  bytes_written = Curl_send_plain(conn, num, mem, len, &result);

  *written = bytes_written;

  return result;
}